

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Value * __thiscall Json::Value::operator[](Value *this,ArrayIndex index)

{
  iterator iVar1;
  Value *pVVar2;
  CZString key;
  String SStack_1a8;
  key_type local_188 [23];
  
  if (*(char *)&this->bits_ == '\0') {
    nullSingleton();
    pVVar2 = &nullSingleton::nullStatic;
  }
  else {
    if (*(char *)&this->bits_ != '\x06') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_188,
                 "in Json::Value::operator[](ArrayIndex)const: requires arrayValue",0x40);
      std::__cxx11::stringbuf::str();
      throwLogicError(&SStack_1a8);
    }
    local_188[0].cstr_ = (char *)0x0;
    local_188[0].field_1.index_ = index;
    iVar1 = std::
            _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
            ::find(&((this->value_).map_)->_M_t,local_188);
    if ((_Rb_tree_header *)iVar1._M_node ==
        &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header) {
      nullSingleton();
      pVVar2 = &nullSingleton::nullStatic;
    }
    else {
      pVVar2 = (Value *)&iVar1._M_node[1]._M_left;
    }
    if ((local_188[0].cstr_ != (char *)0x0) && ((local_188[0].field_1.index_ & 3) == 1)) {
      free(local_188[0].cstr_);
    }
  }
  return pVVar2;
}

Assistant:

ValueType Value::type() const {
  return static_cast<ValueType>(bits_.value_type_);
}